

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper_posix.cpp
# Opt level: O2

void * pstore::memory_mapper::mmap
                 (void *__addr,size_t __len,int __prot,int __flags,int __fd,__off_t __offset)

{
  int __fd_00;
  errno_erc erc;
  void *pvVar1;
  undefined8 *puVar2;
  int *piVar3;
  ostream *__os;
  int in_register_0000000c;
  undefined4 in_register_00000084;
  pointer __len_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  __allocator_type __a2;
  ostringstream message;
  
  __len_00 = (pointer)CONCAT44(in_register_00000084,__fd);
  __fd_00 = *(int *)(__len + 0x28);
  _message = (_func_int **)0x0;
  system_page_size::system_page_size((system_page_size *)&message);
  if (CONCAT44(in_register_0000000c,__flags) % 0 == 0) {
    system_page_size::~system_page_size((system_page_size *)&message);
    if (-1 < in_register_0000000c) {
      pvVar1 = ::mmap((void *)0x0,(size_t)__len_00,__prot * 2 + 1,1,__fd_00,
                      CONCAT44(in_register_0000000c,__flags));
      if (pvVar1 != (void *)0xffffffffffffffff) {
        *(void **)__addr = pvVar1;
        *(undefined8 *)((long)__addr + 8) = 0;
        local_1d8._M_dataplus._M_p = __len_00;
        puVar2 = (undefined8 *)operator_new(0x20);
        _message = (_func_int **)&__a2;
        puVar2[1] = 0x100000001;
        *puVar2 = &PTR___Sp_counted_base_0015ecd0;
        puVar2[2] = __len_00;
        puVar2[3] = pvVar1;
        *(undefined8 **)((long)__addr + 8) = puVar2;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_deleter<void_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/memory_mapper_posix.cpp:150:44),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_deleter<void_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_os_memory_mapper_posix_cpp:150:44),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&message);
        return __addr;
      }
      piVar3 = __errno_location();
      erc.err_ = *piVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&message);
      __os = std::operator<<((ostream *)&message,"Could not memory map file ");
      std::__cxx11::string::string((string *)&local_1d8,(string *)(__len + 8));
      ___a2 = &local_1d8;
      std::__detail::operator<<
                (__os,(_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                       *)&__a2);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::stringbuf::str();
      raise<pstore::errno_erc,std::__cxx11::string>(erc,&local_1d8);
    }
  }
  else {
    system_page_size::~system_page_size((system_page_size *)&message);
  }
  raise<std::errc,char[5]>(invalid_argument,(char (*) [5])"mmap");
}

Assistant:

std::shared_ptr<void> memory_mapper::mmap (file::file_handle & file, bool const write_enabled,
                                               std::uint64_t const offset,
                                               std::uint64_t const length) {
        void * const ptr = ::mmap (nullptr, // base address
                                   length,
                                   PROT_READ | (write_enabled ? PROT_WRITE : 0), // protection flags
                                   MAP_SHARED, file.raw_handle (), checked_offset (offset));
        void const * const map_failed = MAP_FAILED; // NOLINT
        if (ptr == map_failed) {
            int const last_error = errno;
            std::ostringstream message;
            message << "Could not memory map file " << pstore::quoted (file.path ());
            raise (errno_erc{last_error}, message.str ());
        }

        return std::shared_ptr<void> (ptr, [length] (void * const p) {
            if (::munmap (p, length) == -1) {
                raise (errno_erc{errno}, "munmap");
            }
        });
    }